

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcServer.cpp
# Opt level: O3

void __thiscall XmlRpc::XmlRpcServer::enableIntrospection(XmlRpcServer *this,bool enabled)

{
  mapped_type pXVar1;
  mapped_type *ppXVar2;
  XmlRpcServerMethod *pXVar3;
  
  if ((bool)(this->super_XmlRpcSource).field_0xe != enabled) {
    (this->super_XmlRpcSource).field_0xe = enabled;
    if (!enabled) {
      removeMethod(this,&LIST_METHODS_abi_cxx11_);
      removeMethod(this,&METHOD_HELP_abi_cxx11_);
      return;
    }
    pXVar1 = this->_listMethods;
    if (pXVar1 == (mapped_type)0x0) {
      pXVar3 = (XmlRpcServerMethod *)operator_new(0x30);
      XmlRpcServerMethod::XmlRpcServerMethod(pXVar3,&LIST_METHODS_abi_cxx11_,this);
      pXVar3->_vptr_XmlRpcServerMethod = (_func_int **)&PTR__XmlRpcServerMethod_002acc70;
      this->_listMethods = pXVar3;
      pXVar3 = (XmlRpcServerMethod *)operator_new(0x30);
      XmlRpcServerMethod::XmlRpcServerMethod(pXVar3,&METHOD_HELP_abi_cxx11_,this);
      pXVar3->_vptr_XmlRpcServerMethod = (_func_int **)&PTR__XmlRpcServerMethod_002accb8;
      this->_methodHelp = pXVar3;
    }
    else {
      ppXVar2 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcServerMethod_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcServerMethod_*>_>_>
                ::operator[](&this->_methods,&pXVar1->_name);
      *ppXVar2 = pXVar1;
      pXVar1 = this->_methodHelp;
      ppXVar2 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcServerMethod_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcServerMethod_*>_>_>
                ::operator[](&this->_methods,&pXVar1->_name);
      *ppXVar2 = pXVar1;
    }
  }
  return;
}

Assistant:

void XmlRpcServer::enableIntrospection(bool enabled)
{
  if (_introspectionEnabled == enabled)
    return;

  _introspectionEnabled = enabled;

  if (enabled)
  {
    if ( ! _listMethods)
    {
      _listMethods = new ListMethods(this);
      _methodHelp = new MethodHelp(this);
    } else {
      addMethod(_listMethods);
      addMethod(_methodHelp);
    }
  }
  else
  {
    removeMethod(LIST_METHODS);
    removeMethod(METHOD_HELP);
  }
}